

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

void make_session_filename(char *in,strbuf *out)

{
  byte val;
  BinarySink *bs;
  
  if ((in == (char *)0x0) || (*in == '\0')) {
    in = "Default Settings";
  }
  bs = out->binarysink_;
  do {
    val = *in;
    if ((0x34 < val - 0x2b) || ((0x1000000020000dU >> ((ulong)(val - 0x2b) & 0x3f) & 1) == 0)) {
      if (val == 0) {
        return;
      }
      if ((9 < (byte)(val - 0x30)) && (0x19 < (byte)((val & 0xdf) + 0xbf))) {
        BinarySink_put_byte(bs,'%');
        BinarySink_put_byte(bs,"0123456789ABCDEF"[(byte)*in >> 4]);
        val = "0123456789ABCDEF"[(byte)*in & 0xf];
      }
    }
    BinarySink_put_byte(bs,val);
    in = (char *)((byte *)in + 1);
  } while( true );
}

Assistant:

static void make_session_filename(const char *in, strbuf *out)
{
    if (!in || !*in)
        in = "Default Settings";

    while (*in) {
        /*
         * There are remarkably few punctuation characters that
         * aren't shell-special in some way or likely to be used as
         * separators in some file format or another! Hence we use
         * opt-in for safe characters rather than opt-out for
         * specific unsafe ones...
         */
        if (*in!='+' && *in!='-' && *in!='.' && *in!='@' && *in!='_' &&
            !(*in >= '0' && *in <= '9') &&
            !(*in >= 'A' && *in <= 'Z') &&
            !(*in >= 'a' && *in <= 'z')) {
            put_byte(out, '%');
            put_byte(out, hex[((unsigned char) *in) >> 4]);
            put_byte(out, hex[((unsigned char) *in) & 15]);
        } else
            put_byte(out, *in);
        in++;
    }
}